

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

uint ParseConfirmTarget(UniValue *value,uint max_target)

{
  uint uVar1;
  UniValue *__return_storage_ptr__;
  uint *in_R8;
  long in_FS_OFFSET;
  char local_48 [4];
  uint local_44;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_44 = max_target;
  uVar1 = UniValue::getInt<int>(value);
  if (((int)uVar1 < 1) || (local_44 < uVar1)) {
    __return_storage_ptr__ = (UniValue *)__cxa_allocate_exception(0x58);
    local_48[0] = '\x01';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    tinyformat::format<int,unsigned_int>
              (&local_40,(tinyformat *)"Invalid conf_target, must be between %u and %u",local_48,
               (int *)&local_44,in_R8);
    JSONRPCError(__return_storage_ptr__,-8,&local_40);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      __cxa_throw(__return_storage_ptr__,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return uVar1;
  }
  __stack_chk_fail();
}

Assistant:

unsigned int ParseConfirmTarget(const UniValue& value, unsigned int max_target)
{
    const int target{value.getInt<int>()};
    const unsigned int unsigned_target{static_cast<unsigned int>(target)};
    if (target < 1 || unsigned_target > max_target) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Invalid conf_target, must be between %u and %u", 1, max_target));
    }
    return unsigned_target;
}